

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O1

bool __thiscall
VolumeFile::inflateDataIfNeeded
          (VolumeFile *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *in,
          uint64_t outSize)

{
  int *piVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  ulong uVar5;
  bool bVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  if (outSize >> 0x20 == 0) {
    piVar1 = (int *)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
    bVar6 = false;
    if ((*piVar1 == -0x8113b) && (piVar1[1] == -(int)outSize)) {
      uVar5 = (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar1;
      bVar6 = 7 < uVar5;
      if (bVar6) {
        local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        FileExpand::inflate(&local_28,(uint8_t *)(piVar1 + 2),uVar5 - 8);
        puVar2 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar3 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar4 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start =
             local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish =
             local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        if (puVar2 != (pointer)0x0) {
          local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = puVar2;
          local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar3;
          local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = puVar4;
          operator_delete(puVar2,(long)puVar4 - (long)puVar2);
        }
        bVar6 = true;
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool VolumeFile::inflateDataIfNeeded(std::vector<uint8_t>& in, uint64_t outSize) const {
	if (outSize > UINT32_MAX)
		return false;

	const auto* p = in.data();

	// XXX: inflated data use little-endian always.
	const auto magic = readNext<uint32_t>(p);
	const auto sizeComplement = readNext<uint32_t>(p);

	if (magic != Z_MAGIC || (static_cast<uint32_t>(outSize) + sizeComplement) != 0) { // not compressed?
		return false;
	}

	const auto headerSize = sizeof(magic) + sizeof(sizeComplement);
	if (in.size() < headerSize) {
		return false;
	}

	std::vector<uint8_t> out;
	FileExpand::inflate(out, p, in.size() - headerSize);
	in.swap(out);

	return true;
}